

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.hpp
# Opt level: O1

void cali::util::
     split<std::__cxx11::string,char,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input,char sep,
               back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               out)

{
  size_type sVar1;
  pointer pcVar2;
  size_type sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  value_type local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  sVar1 = input->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (input->_M_dataplus)._M_p;
    sVar3 = 0;
    do {
      if (pcVar2[sVar3] == sep) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(out.container,&local_50);
        local_50._M_string_length = 0;
        *local_50._M_dataplus._M_p = '\0';
      }
      else {
        std::__cxx11::string::push_back((char)&local_50);
      }
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
  }
  if (local_50._M_string_length != 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(out.container,&local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void split(String input, Char sep, OutputIterator out)
{
    String str;

    for (Char c : input) {
        if (c == sep) {
            *out++ = str;
            str.clear();
        } else {
            str.push_back(c);
        }
    }

    if (!str.empty())
        *out++ = str;
}